

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_filling_magic_number.cc
# Opt level: O1

int __thiscall sptk::InputSourceFillingMagicNumber::Proceed(InputSourceFillingMagicNumber *this)

{
  _Elt_pointer pvVar1;
  double dVar2;
  double dVar3;
  _Elt_pointer pvVar4;
  double *pdVar5;
  pointer piVar6;
  _Map_pointer ppvVar7;
  _Elt_pointer pvVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  _Elt_pointer pvVar10;
  pointer pdVar11;
  pointer pdVar12;
  uint uVar13;
  int iVar14;
  _Map_pointer ppvVar15;
  ulong uVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  ulong uVar18;
  double *pdVar19;
  vector<double,_std::allocator<double>_> *pvVar20;
  double *pdVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  _Map_pointer ppvVar27;
  long lVar28;
  _Elt_pointer pvVar29;
  double dVar30;
  double dVar31;
  vector<double,_std::allocator<double>_> curr_data;
  value_type local_48;
  
  pvVar4 = (this->queue_).
           super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->queue_).
      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pvVar4) goto LAB_001052bf;
  pdVar19 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar23 = (long)pdVar5 - (long)pdVar19 >> 5;
  pdVar21 = pdVar19;
  if (0 < lVar23) {
    dVar30 = this->magic_number_;
    pdVar21 = (double *)(((long)pdVar5 - (long)pdVar19 & 0xffffffffffffffe0U) + (long)pdVar19);
    lVar23 = lVar23 + 1;
    pdVar19 = pdVar19 + 2;
    do {
      if ((dVar30 == pdVar19[-2]) && (!NAN(dVar30) && !NAN(pdVar19[-2]))) {
        pdVar19 = pdVar19 + -2;
        goto LAB_001052b6;
      }
      if ((dVar30 == pdVar19[-1]) && (!NAN(dVar30) && !NAN(pdVar19[-1]))) {
        pdVar19 = pdVar19 + -1;
        goto LAB_001052b6;
      }
      if ((dVar30 == *pdVar19) && (!NAN(dVar30) && !NAN(*pdVar19))) goto LAB_001052b6;
      if ((dVar30 == pdVar19[1]) && (!NAN(dVar30) && !NAN(pdVar19[1]))) {
        pdVar19 = pdVar19 + 1;
        goto LAB_001052b6;
      }
      lVar23 = lVar23 + -1;
      pdVar19 = pdVar19 + 4;
    } while (1 < lVar23);
  }
  lVar23 = (long)pdVar5 - (long)pdVar21 >> 3;
  if (lVar23 == 1) {
LAB_001052a3:
    if ((this->magic_number_ != *pdVar21) ||
       (pdVar19 = pdVar21, NAN(this->magic_number_) || NAN(*pdVar21))) {
      pdVar19 = pdVar5;
    }
  }
  else if (lVar23 == 2) {
LAB_0010527b:
    if ((this->magic_number_ != *pdVar21) ||
       (pdVar19 = pdVar21, NAN(this->magic_number_) || NAN(*pdVar21))) {
      pdVar21 = pdVar21 + 1;
      goto LAB_001052a3;
    }
  }
  else {
    pdVar19 = pdVar5;
    if (lVar23 == 3) {
      if ((this->magic_number_ != *pdVar21) ||
         (pdVar19 = pdVar21, NAN(this->magic_number_) || NAN(*pdVar21))) {
        pdVar21 = pdVar21 + 1;
        goto LAB_0010527b;
      }
    }
  }
LAB_001052b6:
  if (pdVar19 == pdVar5) {
    return 2;
  }
LAB_001052bf:
  uVar13 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])(this);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar14 = (*this->source_->_vptr_InputSourceInterface[4])();
  if ((char)iVar14 == '\0') {
    pvVar4 = (this->queue_).
             super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pvVar8 = (this->queue_).
             super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar8 == pvVar4) {
      iVar14 = 0;
    }
    else {
      iVar14 = 2;
      if (0 < (int)uVar13) {
        pdVar11 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar12 = (this->final_output_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar10 = (this->queue_).
                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppvVar7 = (this->queue_).
                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        uVar24 = 0;
        do {
          dVar30 = this->magic_number_;
          pdVar19 = pdVar11 + uVar24;
          if ((dVar30 == *pdVar19) && (!NAN(dVar30) && !NAN(*pdVar19))) {
            pdVar19 = pdVar12 + uVar24;
            pvVar29 = pvVar4;
            pvVar1 = pvVar10;
            ppvVar27 = ppvVar7;
            if ((dVar30 == *pdVar19) && (!NAN(dVar30) && !NAN(*pdVar19))) {
              iVar14 = 1;
              break;
            }
            while (pvVar29 != pvVar8) {
              (pvVar29->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar24] = pdVar12[uVar24];
              pvVar29 = pvVar29 + 1;
              if (pvVar29 == pvVar1) {
                pvVar29 = ppvVar27[1];
                ppvVar27 = ppvVar27 + 1;
                pvVar1 = pvVar29 + 0x15;
              }
            }
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar13);
      }
    }
  }
  else {
    if (0 < (int)uVar13) {
      piVar6 = (this->magic_number_region_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppvVar7 = (this->queue_).
                super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppvVar27 = (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      pvVar4 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      pvVar8 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pvVar9 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      pvVar10 = (this->queue_).
                super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar24 = ((long)pvVar8 - (long)pvVar9 >> 3) * -0x5555555555555555;
      pdVar11 = (this->final_output_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar25 = 0;
      do {
        dVar30 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar25];
        dVar2 = this->magic_number_;
        if ((dVar2 != dVar30) || (NAN(dVar2) || NAN(dVar30))) {
          iVar14 = piVar6[uVar25];
          lVar23 = (long)iVar14;
          if (lVar23 != 0) {
            if (iVar14 == (int)((ulong)((long)pvVar4 - (long)pvVar10) >> 3) * -0x55555555 +
                          (int)uVar24 +
                          ((int)((ulong)((long)ppvVar7 - (long)ppvVar27) >> 3) + -1 +
                          (uint)(ppvVar7 == (_Map_pointer)0x0)) * 0x15) {
              dVar3 = pdVar11[uVar25];
              if ((dVar2 != dVar3) || (dVar31 = dVar30, NAN(dVar2) || NAN(dVar3))) {
                dVar31 = dVar3;
              }
            }
            else {
              uVar18 = uVar24 - lVar23;
              if (uVar18 < 0x15) {
                pvVar17 = pvVar8 + -lVar23;
                ppvVar15 = ppvVar7;
                pvVar20 = pvVar9;
              }
              else {
                if ((long)uVar18 < 1) {
                  uVar22 = ~(~uVar18 / 0x15);
                }
                else {
                  uVar22 = uVar18 / 0x15;
                }
                ppvVar15 = ppvVar7 + uVar22;
                pvVar20 = *ppvVar15;
                pvVar17 = pvVar20 + uVar22 * -0x15 + uVar18;
              }
              if (pvVar17 == pvVar20) {
                pvVar17 = ppvVar15[-1] + 0x15;
              }
              dVar31 = pvVar17[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar25];
            }
            if (0 < iVar14) {
              dVar31 = dVar31 - dVar30;
              lVar28 = 0;
              uVar18 = ~uVar24;
              uVar22 = uVar24;
              lVar26 = (long)pvVar8 - (long)pvVar9;
              do {
                if (uVar22 < 0x15) {
                  pvVar17 = pvVar8 + -lVar28;
                  ppvVar15 = ppvVar7;
                  pvVar20 = pvVar9;
                }
                else {
                  if ((long)uVar22 < 1) {
                    uVar16 = ~(uVar18 / 0x15);
                  }
                  else {
                    uVar16 = uVar22 / 0x15;
                  }
                  ppvVar15 = ppvVar7 + uVar16;
                  pvVar20 = *ppvVar15;
                  pvVar17 = (vector<double,_std::allocator<double>_> *)
                            ((long)&pvVar20[uVar16 * -0x15].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar26);
                }
                if (pvVar17 == pvVar20) {
                  pvVar17 = ppvVar15[-1] + 0x15;
                }
                dVar30 = dVar30 + dVar31 / (double)(iVar14 + 1);
                pvVar17[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar25] = dVar30;
                lVar28 = lVar28 + 1;
                uVar22 = uVar22 - 1;
                lVar26 = lVar26 + -0x18;
                uVar18 = uVar18 + 1;
                lVar23 = lVar23 + -1;
              } while (lVar23 != 0);
            }
            piVar6[uVar25] = 0;
          }
        }
        else {
          piVar6[uVar25] = piVar6[uVar25] + 1;
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar13);
    }
    iVar14 = 3;
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->queue_,&local_48);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar14;
}

Assistant:

int InputSourceFillingMagicNumber::Proceed() {
  // If magic number is not in the front of queue, you can output the data.
  if (!queue_.empty()) {
    if (std::find_if(queue_.front().begin(), queue_.front().end(),
                     [this](double x) { return magic_number_ == x; }) ==
        queue_.front().end()) {
      return kGood;
    }
  }

  const int data_size(GetSize());

  // Load new data.
  std::vector<double> curr_data;
  if (!source_->Get(&curr_data)) {
    if (queue_.empty()) {
      return kExit;
    }
    for (int i(0); i < data_size; ++i) {
      if (magic_number_ == queue_.front()[i]) {
        if (magic_number_ == final_output_[i]) {
          // This means all the data is magic number.
          return kFail;
        }
        // Replace magic number with final output value.
        for (std::deque<std::vector<double> >::iterator itr(queue_.begin());
             itr != queue_.end(); ++itr) {
          (*itr)[i] = final_output_[i];
        }
      }
    }
    return kGood;
  }

  for (int i(0); i < data_size; ++i) {
    const double right(curr_data[i]);

    if (magic_number_ == right) {
      ++magic_number_region_[i];
    } else if (magic_number_region_[i]) {
      // Interpolate magic numbers.
      double left;
      if (static_cast<int>(queue_.size()) != magic_number_region_[i]) {
        left = (*(queue_.rbegin() + magic_number_region_[i]))[i];
      } else if (magic_number_ != final_output_[i]) {
        left = final_output_[i];
      } else {
        left = right;
      }
      const double slope((left - right) / (magic_number_region_[i] + 1));
      double value(right);
      for (int j(0); j < magic_number_region_[i]; ++j) {
        value += slope;
        (*(queue_.rbegin() + j))[i] = value;
      }
      magic_number_region_[i] = 0;
    }
  }
  queue_.push_back(curr_data);

  return kWait;
}